

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

int __thiscall
MlmWrap::calculateDeviceChannelInfoIndices
          (MlmWrap *this,vector<int,_std::allocator<int>_> *indices,
          vector<int,_std::allocator<int>_> *startlengths,int startbyte,int bit)

{
  pointer piVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int bit_local;
  int local_14;
  
  piVar1 = (startlengths->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = 0;
  iVar2 = 0;
  uVar3 = 0;
  do {
    if ((ulong)((long)(startlengths->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar3) {
      return -1;
    }
    iVar5 = piVar1[uVar3] - iVar4;
    iVar4 = piVar1[uVar3] + piVar1[uVar3 + 1];
    iVar2 = iVar2 + iVar5;
    uVar3 = uVar3 + 2;
  } while (iVar4 <= startbyte);
  _bit_local = CONCAT44(startbyte - iVar2,bit);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(indices,&local_14);
  std::vector<int,_std::allocator<int>_>::push_back(indices,&bit_local);
  return iVar2;
}

Assistant:

int MlmWrap::calculateDeviceChannelInfoIndices(std::vector<int> &indices, std::vector<int>& startlengths, int startbyte, int bit){
    //push back index, adjusted for analog's dataformat
    //returns the gap, which when subtracted from startbyte (start byte in trodes packet), returns the startbyte of the actual analog packet
    int prev = 0;
    int gap = 0;
    for(size_t i = 0; i < startlengths.size(); i+=2){
        gap += startlengths[i] - prev;
        prev = startlengths[i] + startlengths[i+1];
        if(startbyte < startlengths[i] + startlengths[i+1]){
            //Channel in this block. subtract total gap
            indices.push_back(startbyte - gap);
            indices.push_back(bit);
            return gap;
        }
    }
    return -1;
}